

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

int __thiscall
cmsys::SystemInformationImplementation::GetFullyQualifiedDomainName
          (SystemInformationImplementation *this,string *fqdn)

{
  ushort uVar1;
  socklen_t __salen;
  int iVar2;
  size_t sVar3;
  long lVar4;
  int iVar5;
  ifaddrs *piVar6;
  bool bVar7;
  allocator<char> local_879;
  size_t local_878;
  ifaddrs *ifas;
  string candidate;
  char host [1025];
  char base [1025];
  
  std::__cxx11::string::assign((char *)fqdn);
  iVar2 = gethostname(base,0x401);
  if (iVar2 == 0) {
    sVar3 = strlen(base);
    std::__cxx11::string::assign((char *)fqdn);
    piVar6 = (ifaddrs *)&ifas;
    iVar2 = getifaddrs(piVar6);
    if (iVar2 == 0) {
      local_878 = sVar3;
      iVar2 = 0;
      do {
        while( true ) {
          while( true ) {
            do {
              iVar5 = iVar2;
              piVar6 = piVar6->ifa_next;
              if (piVar6 == (ifaddrs *)0x0) goto LAB_00336693;
              iVar2 = iVar5;
            } while (((piVar6->ifa_addr == (sockaddr *)0x0) ||
                     (uVar1 = piVar6->ifa_addr->sa_family, (uVar1 | 8) != 10)) ||
                    ((piVar6->ifa_flags & 8) != 0));
            memset(host,0,0x401);
            __salen = 0x1c;
            if (uVar1 == 2) {
              __salen = 0x10;
            }
            iVar2 = getnameinfo((sockaddr *)piVar6->ifa_addr,__salen,host,0x401,(char *)0x0,0,8);
            if (iVar2 == 0) break;
            iVar2 = -3;
          }
          std::__cxx11::string::string<std::allocator<char>>((string *)&candidate,host,&local_879);
          lVar4 = std::__cxx11::string::find((char *)&candidate,(ulong)base);
          bVar7 = candidate._M_string_length <= local_878;
          if (!bVar7 && lVar4 != -1) break;
          std::__cxx11::string::~string((string *)&candidate);
          iVar2 = 0;
        }
        std::__cxx11::string::_M_assign((string *)fqdn);
        std::__cxx11::string::~string((string *)&candidate);
        iVar5 = 0;
        iVar2 = 0;
      } while (bVar7 || lVar4 == -1);
LAB_00336693:
      freeifaddrs(ifas);
    }
    else {
      iVar5 = -2;
    }
  }
  else {
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

int SystemInformationImplementation::GetFullyQualifiedDomainName(
  std::string& fqdn)
{
  // in the event of absolute failure return localhost.
  fqdn = "localhost";

#if defined(_WIN32)
  int ierr;
  // TODO - a more robust implementation for windows, see comments
  // in unix implementation.
  WSADATA wsaData;
  WORD ver = MAKEWORD(2, 0);
  ierr = WSAStartup(ver, &wsaData);
  if (ierr) {
    return -1;
  }

  char base[256] = { '\0' };
  ierr = gethostname(base, 256);
  if (ierr) {
    WSACleanup();
    return -2;
  }
  fqdn = base;

  HOSTENT* hent = gethostbyname(base);
  if (hent) {
    fqdn = hent->h_name;
  }

  WSACleanup();
  return 0;

#elif defined(KWSYS_SYSTEMINFORMATION_IMPLEMENT_FQDN)
  // gethostname typical returns an alias for loopback interface
  // we want the fully qualified domain name. Because there are
  // any number of interfaces on this system we look for the
  // first of these that contains the name returned by gethostname
  // and is longer. failing that we return gethostname and indicate
  // with a failure code. Return of a failure code is not necessarily
  // an indication of an error. for instance gethostname may return
  // the fully qualified domain name, or there may not be one if the
  // system lives on a private network such as in the case of a cluster
  // node.

  int ierr = 0;
  char base[NI_MAXHOST];
  ierr = gethostname(base, NI_MAXHOST);
  if (ierr) {
    return -1;
  }
  size_t baseSize = strlen(base);
  fqdn = base;

  struct ifaddrs* ifas;
  struct ifaddrs* ifa;
  ierr = getifaddrs(&ifas);
  if (ierr) {
    return -2;
  }

  for (ifa = ifas; ifa != KWSYS_NULLPTR; ifa = ifa->ifa_next) {
    int fam = ifa->ifa_addr ? ifa->ifa_addr->sa_family : -1;
    // Skip Loopback interfaces
    if (((fam == AF_INET) || (fam == AF_INET6)) &&
        !(ifa->ifa_flags & IFF_LOOPBACK)) {
      char host[NI_MAXHOST] = { '\0' };

      const size_t addrlen = (fam == AF_INET ? sizeof(struct sockaddr_in)
                                             : sizeof(struct sockaddr_in6));

      ierr = getnameinfo(ifa->ifa_addr, static_cast<socklen_t>(addrlen), host,
                         NI_MAXHOST, KWSYS_NULLPTR, 0, NI_NAMEREQD);
      if (ierr) {
        // don't report the failure now since we may succeed on another
        // interface. If all attempts fail then return the failure code.
        ierr = -3;
        continue;
      }

      std::string candidate = host;
      if ((candidate.find(base) != std::string::npos) &&
          baseSize < candidate.size()) {
        // success, stop now.
        ierr = 0;
        fqdn = candidate;
        break;
      }
    }
  }
  freeifaddrs(ifas);

  return ierr;
#else
  /* TODO: Implement on more platforms.  */
  fqdn = this->GetHostname();
  return -1;
#endif
}